

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

bam_hdr_t * sam_hdr_read(htsFile *fp)

{
  kstring_t *str;
  htsExactFormat hVar1;
  bool bVar2;
  int iVar3;
  bam_hdr_t *pbVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  FILE *__stream;
  FILE *__filename;
  size_t __n;
  char line [2048];
  kstring_t local_858;
  char local_838 [2056];
  
  hVar1 = (fp->format).format;
  if (hVar1 != sam) {
    if (hVar1 == cram) {
      pbVar4 = cram_header_to_bam(((fp->fp).cram)->header);
      return pbVar4;
    }
    if (hVar1 != bam) {
      abort();
    }
    pbVar4 = bam_hdr_read((fp->fp).bgzf);
    return pbVar4;
  }
  str = &fp->line;
  local_858.l = 0;
  local_858.m = 0;
  local_858.s = (char *)0x0;
  __filename = (FILE *)fp;
  iVar3 = hts_getline(fp,2,str);
  if (iVar3 < 0) {
LAB_00113ba0:
    __filename = (FILE *)fp->fn_aux;
    if (__filename != (FILE *)0x0) {
      __stream = fopen((char *)__filename,"r");
      if (__stream == (FILE *)0x0) {
        return (bam_hdr_t *)0x0;
      }
      pcVar7 = fgets(local_838,0x800,__stream);
      if (pcVar7 != (char *)0x0) {
        do {
          pcVar7 = strtok(local_838,"\t");
          pcVar6 = strtok((char *)0x0,"\t");
          ksprintf(&local_858,"@SQ\tSN:%s\tLN:%s\n",pcVar7,pcVar6);
          pcVar7 = fgets(local_838,0x800,__stream);
        } while (pcVar7 != (char *)0x0);
      }
      __filename = __stream;
      fclose(__stream);
      if (__stream == (FILE *)0x0) {
        return (bam_hdr_t *)0x0;
      }
    }
  }
  else {
    bVar2 = false;
    do {
      pcVar7 = (fp->line).s;
      if (*pcVar7 != '@') break;
      uVar5 = str->l;
      if ((3 < uVar5) && (iVar3 = strncmp(pcVar7,"@SQ",3), iVar3 == 0)) {
        bVar2 = true;
      }
      __n = (size_t)(int)uVar5;
      uVar5 = local_858.l + __n + 1;
      pcVar6 = local_858.s;
      if (uVar5 < local_858.m) {
LAB_00113add:
        local_858.s = pcVar6;
        memcpy(local_858.s + local_858.l,pcVar7,__n);
        local_858.l = __n + local_858.l;
        local_858.s[local_858.l] = '\0';
      }
      else {
        uVar5 = uVar5 >> 1 | uVar5;
        uVar5 = uVar5 >> 2 | uVar5;
        uVar5 = uVar5 >> 4 | uVar5;
        uVar5 = uVar5 >> 8 | uVar5;
        local_858.m = (uVar5 >> 0x10 | uVar5) + 1;
        pcVar6 = (char *)realloc(local_858.s,local_858.m);
        if (pcVar6 != (char *)0x0) goto LAB_00113add;
      }
      uVar5 = local_858.l + 1;
      pcVar7 = local_858.s;
      if (uVar5 < local_858.m) {
LAB_00113b5e:
        local_858.s = pcVar7;
        local_858.s[local_858.l] = '\n';
        local_858.s[local_858.l + 1] = '\0';
        local_858.l = local_858.l + 1;
      }
      else {
        uVar5 = uVar5 >> 1 | uVar5;
        uVar5 = uVar5 >> 2 | uVar5;
        uVar5 = uVar5 >> 4 | uVar5;
        uVar5 = uVar5 >> 8 | uVar5;
        local_858.m = (uVar5 >> 0x10 | uVar5) + 1;
        pcVar7 = (char *)realloc(local_858.s,local_858.m);
        if (pcVar7 != (char *)0x0) goto LAB_00113b5e;
      }
      __filename = (FILE *)fp;
      iVar3 = hts_getline(fp,2,str);
    } while (-1 < iVar3);
    if (!bVar2) goto LAB_00113ba0;
  }
  iVar3 = (int)__filename;
  if (local_858.l == 0) {
    pcVar7 = local_858.s;
    if (local_858.m < 2) {
      local_858.m = 2;
      pcVar6 = local_858.s;
      pcVar7 = (char *)realloc(local_858.s,2);
      iVar3 = (int)pcVar6;
      if (pcVar7 == (char *)0x0) goto LAB_00113c7d;
    }
    local_858.s = pcVar7;
    local_858.s[local_858.l] = '\0';
  }
LAB_00113c7d:
  pbVar4 = sam_hdr_parse(iVar3,local_858.s);
  pbVar4->l_text = (uint32_t)local_858.l;
  pbVar4->text = local_858.s;
  return pbVar4;
}

Assistant:

bam_hdr_t *sam_hdr_read(htsFile *fp)
{
    switch (fp->format.format) {
    case bam:
        return bam_hdr_read(fp->fp.bgzf);

    case cram:
        return cram_header_to_bam(fp->fp.cram->header);

    case sam: {
        kstring_t str;
        bam_hdr_t *h;
        int has_SQ = 0;
        str.l = str.m = 0; str.s = 0;
        while (hts_getline(fp, KS_SEP_LINE, &fp->line) >= 0) {
            if (fp->line.s[0] != '@') break;
            if (fp->line.l > 3 && strncmp(fp->line.s,"@SQ",3) == 0) has_SQ = 1;
            kputsn(fp->line.s, fp->line.l, &str);
            kputc('\n', &str);
        }
        if (! has_SQ && fp->fn_aux) {
            char line[2048];
            FILE *f = fopen(fp->fn_aux, "r");
            if (f == NULL) return NULL;
            while (fgets(line, sizeof line, f)) {
                const char *name = strtok(line, "\t");
                const char *length = strtok(NULL, "\t");
                ksprintf(&str, "@SQ\tSN:%s\tLN:%s\n", name, length);
            }
            fclose(f);
        }
        if (str.l == 0) kputsn("", 0, &str);
        h = sam_hdr_parse(str.l, str.s);
        h->l_text = str.l; h->text = str.s;
        return h;
        }

    default:
        abort();
    }
}